

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

int * Gia_SortGetTest(int nSize)

{
  int iVar1;
  int *piVar2;
  int *pArray;
  int i;
  int nSize_local;
  
  srand(0);
  piVar2 = (int *)malloc((long)nSize << 2);
  for (pArray._0_4_ = 0; (int)pArray < nSize; pArray._0_4_ = (int)pArray + 1) {
    iVar1 = rand();
    piVar2[(int)pArray] = iVar1;
  }
  return piVar2;
}

Assistant:

int * Gia_SortGetTest( int nSize )
{
    int i, * pArray;
    srand( 0 );
    pArray = ABC_ALLOC( int, nSize );
    for ( i = 0; i < nSize; i++ )
        pArray[i] = rand();
    return pArray;
}